

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXR(float **out_rgba,int *width,int *height,char *filename,char **err)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  EXRVersion EStack_108fc;
  EXRImage EStack_108e8;
  EXRHeader EStack_108c0;
  
  if (out_rgba == (float **)0x0) {
    iVar5 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar8 = "Invalid argument.\n";
  }
  else {
    memset(&EStack_108c0,0,0x10890);
    EStack_108e8.tiles = (EXRTile *)0x0;
    EStack_108e8.images._0_4_ = 0;
    EStack_108e8.images._4_4_ = 0;
    EStack_108e8.width = 0;
    EStack_108e8.height = 0;
    EStack_108e8.num_channels = 0;
    iVar5 = ParseEXRVersionFromFile(&EStack_108fc,filename);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (EStack_108fc.non_image == 0 && EStack_108fc.multipart == 0) {
      iVar5 = ParseEXRHeaderFromFile(&EStack_108c0,&EStack_108fc,filename,err);
      if (iVar5 != 0) {
        return iVar5;
      }
      if (0 < EStack_108c0.num_channels) {
        lVar11 = 0;
        do {
          if (EStack_108c0.pixel_types[lVar11] == 1) {
            EStack_108c0.requested_pixel_types[lVar11] = 2;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < EStack_108c0.num_channels);
      }
      iVar6 = LoadEXRImageFromFile(&EStack_108e8,&EStack_108c0,filename,err);
      iVar5 = EStack_108e8.width;
      if (iVar6 != 0) {
        return iVar6;
      }
      if (0 < (long)EStack_108c0.num_channels) {
        pcVar8 = (EStack_108c0.channels)->name + 1;
        uVar10 = 0xffffffff;
        uVar9 = 0;
        uVar16 = 0xffffffff;
        uVar12 = 0xffffffff;
        uVar13 = 0xffffffff;
        do {
          cVar1 = ((EXRChannelInfo *)(pcVar8 + -1))->name[0];
          if (cVar1 == 'R') {
            if (*pcVar8 == '\0') {
              uVar13 = uVar9 & 0xffffffff;
            }
          }
          else if (cVar1 == 'A') {
            if (*pcVar8 == '\0') {
              uVar10 = uVar9 & 0xffffffff;
            }
          }
          else if (cVar1 == 'B') {
            if (*pcVar8 == '\0') {
              uVar16 = uVar9 & 0xffffffff;
            }
          }
          else if ((cVar1 == 'G') && (*pcVar8 == '\0')) {
            uVar12 = uVar9 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
          pcVar8 = pcVar8 + 0x110;
        } while ((long)EStack_108c0.num_channels != uVar9);
        if ((int)uVar13 != -1) {
          if ((int)uVar12 == -1) {
            iVar5 = -4;
            if (err == (char **)0x0) {
              return -4;
            }
            pcVar8 = "G channel not found\n";
          }
          else {
            if ((int)uVar16 != -1) {
              iVar6 = EStack_108e8.height;
              pfVar7 = (float *)malloc((long)EStack_108e8.width * (long)EStack_108e8.height * 0x10);
              *out_rgba = pfVar7;
              uVar14 = iVar6 * iVar5;
              if (0 < (int)uVar14) {
                lVar4 = CONCAT44(EStack_108e8.images._4_4_,EStack_108e8.images._0_4_);
                lVar11 = *(long *)(lVar4 + (long)(int)uVar13 * 8);
                lVar2 = *(long *)(lVar4 + (long)(int)uVar12 * 8);
                lVar3 = *(long *)(lVar4 + (long)(int)uVar16 * 8);
                lVar15 = 0;
                do {
                  pfVar7[lVar15] = *(float *)(lVar11 + lVar15);
                  pfVar7[lVar15 + 1] = *(float *)(lVar2 + lVar15);
                  pfVar7[lVar15 + 2] = *(float *)(lVar3 + lVar15);
                  fVar17 = 1.0;
                  if ((int)uVar10 != -1) {
                    fVar17 = *(float *)(*(long *)(lVar4 + (long)(int)uVar10 * 8) + lVar15);
                  }
                  pfVar7[lVar15 + 3] = fVar17;
                  lVar15 = lVar15 + 4;
                } while ((ulong)uVar14 << 2 != lVar15);
              }
              *width = iVar5;
              *height = iVar6;
              FreeEXRHeader(&EStack_108c0);
              return 0;
            }
            iVar5 = -4;
            if (err == (char **)0x0) {
              return -4;
            }
            pcVar8 = "B channel not found\n";
          }
          goto LAB_00126f58;
        }
      }
      iVar5 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar8 = "R channel not found\n";
    }
    else {
      iVar5 = -4;
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar8 = "Loading multipart or DeepImage is not supported yet.\n";
    }
  }
LAB_00126f58:
  *err = pcVar8;
  return iVar5;
}

Assistant:

int LoadEXR(float **out_rgba, int *width, int *height, const char *filename,
            const char **err) {
  if (out_rgba == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);
  InitEXRImage(&exr_image);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      if (err) {
        (*err) = "Loading multipart or DeepImage is not supported yet.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  {
    int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  {
    int ret = LoadEXRImageFromFile(&exr_image, &exr_header, filename, err);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  (*out_rgba) = reinterpret_cast<float *>(
      malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
             static_cast<size_t>(exr_image.height)));
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    (*out_rgba)[4 * i + 0] =
        reinterpret_cast<float **>(exr_image.images)[idxR][i];
    (*out_rgba)[4 * i + 1] =
        reinterpret_cast<float **>(exr_image.images)[idxG][i];
    (*out_rgba)[4 * i + 2] =
        reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA != -1) {
      (*out_rgba)[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      (*out_rgba)[4 * i + 3] = 1.0;
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);

  return TINYEXR_SUCCESS;
}